

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::GetVariableComponent
          (InterfaceVariableScalarReplacement *this,Instruction *var,uint32_t *component)

{
  bool bVar1;
  uint32_t id;
  IRContext *this_00;
  DecorationManager *this_01;
  anon_class_8_1_c227a39d local_48;
  function<bool_(const_spvtools::opt::Instruction_&)> local_40;
  uint32_t *local_20;
  uint32_t *component_local;
  Instruction *var_local;
  InterfaceVariableScalarReplacement *this_local;
  
  local_20 = component;
  component_local = (uint32_t *)var;
  var_local = (Instruction *)this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_decoration_mgr(this_00);
  id = opt::Instruction::result_id((Instruction *)component_local);
  local_48.component = local_20;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::InterfaceVariableScalarReplacement::GetVariableComponent(spvtools::opt::Instruction*,unsigned_int*)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_40,&local_48);
  bVar1 = analysis::DecorationManager::WhileEachDecoration(this_01,id,0x1f,&local_40);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_40);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool InterfaceVariableScalarReplacement::GetVariableComponent(
    Instruction* var, uint32_t* component) {
  return !context()->get_decoration_mgr()->WhileEachDecoration(
      var->result_id(), uint32_t(spv::Decoration::Component),
      [component](const Instruction& inst) {
        *component =
            inst.GetSingleWordInOperand(kOpDecorateLiteralInOperandIndex);
        return false;
      });
}